

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 *puVar1;
  int iVar2;
  Mat *pMVar3;
  void *pvVar4;
  long *plVar5;
  Allocator *pAVar6;
  long *plVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  int *piVar27;
  pointer pMVar28;
  int iVar29;
  undefined8 *puVar30;
  pointer pMVar31;
  int *piVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  uint uVar39;
  int iVar40;
  int iVar41;
  undefined8 uVar42;
  ulong uVar43;
  undefined4 uVar44;
  Mat *pMVar45;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar46;
  bool bVar47;
  int iVar48;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int _outw;
  int _outh;
  int _woffset;
  int local_180;
  uint local_17c;
  uint local_178;
  int _outc;
  int _outd;
  int _hoffset;
  Mat m_1;
  int _coffset;
  Option *local_118;
  Mat *local_110;
  int local_108;
  int _doffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_100;
  Crop *local_f8;
  ulong local_f0;
  int local_e4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  undefined4 local_68;
  undefined4 local_58;
  undefined4 local_48;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_17c = pMVar3->w;
  local_178 = pMVar3->h;
  local_e4 = pMVar3->d;
  local_180 = pMVar3->c;
  uVar39 = pMVar3->dims;
  local_f0 = (ulong)uVar39;
  uVar38 = pMVar3->elemsize;
  iVar29 = pMVar3->elempack;
  pMVar45 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_118 = opt;
  local_100 = bottom_blobs;
  local_f8 = &this->super_Crop;
  if (((this->super_Crop).starts_expr._M_string_length != 0) &&
     ((this->super_Crop).ends_expr._M_string_length != 0)) {
    local_110 = pMVar45;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blob_shapes,
               ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 3) *
               -0x71c71c71c71c71c7,(allocator_type *)&m_1);
    pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar31) {
      lVar37 = 0;
      uVar43 = 0;
      do {
        pMVar28 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        switch(*(undefined4 *)((long)&pMVar31->dims + lVar37)) {
        case 1:
          uVar35 = (long)*(int *)((long)&pMVar31->elempack + lVar37) *
                   (long)*(int *)((long)&pMVar31->w + lVar37);
          local_48 = 1;
          iVar41 = 1;
          iVar36 = (int)uVar35;
          break;
        case 2:
          iVar36 = *(int *)((long)&pMVar31->w + lVar37);
          lVar34 = (long)*(int *)((long)&pMVar31->elempack + lVar37) *
                   (long)*(int *)((long)&pMVar31->h + lVar37);
          iVar41 = (int)lVar34;
          local_48 = 2;
          uVar35 = lVar34 * iVar36;
          break;
        case 3:
          iVar36 = *(int *)((long)&pMVar31->w + lVar37);
          iVar41 = *(int *)((long)&pMVar31->h + lVar37);
          iVar40 = *(int *)((long)&pMVar31->elempack + lVar37) *
                   *(int *)((long)&pMVar31->c + lVar37);
          local_58 = 3;
          iVar48 = 1;
          lVar34 = (long)iVar41 * (long)iVar36;
          local_48 = local_58;
          goto LAB_00276f3a;
        case 4:
          iVar36 = *(int *)((long)&pMVar31->w + lVar37);
          iVar41 = *(int *)((long)&pMVar31->h + lVar37);
          iVar48 = *(int *)((long)&pMVar31->d + lVar37);
          iVar40 = *(int *)((long)&pMVar31->elempack + lVar37) *
                   *(int *)((long)&pMVar31->c + lVar37);
          local_68 = 4;
          lVar34 = (long)iVar41 * (long)iVar36 * (long)iVar48;
          local_48 = local_68;
LAB_00276f3a:
          uVar44 = 1;
          uVar35 = lVar34 + 3U & 0x3ffffffffffffffc;
          uVar42 = 4;
          goto LAB_00276f9d;
        default:
          uVar42 = 0;
          uVar35 = 0;
          iVar40 = 0;
          local_48 = 0;
          iVar36 = 0;
          iVar41 = 0;
          iVar48 = 0;
          uVar44 = 0;
          goto LAB_00276f9d;
        }
        iVar48 = 1;
        iVar40 = 1;
        uVar42 = 4;
        uVar44 = 1;
LAB_00276f9d:
        piVar32 = *(int **)((long)&(bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->refcount + lVar37);
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            pvVar4 = *(void **)((long)&(bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->data + lVar37);
            plVar5 = *(long **)((long)&(bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->allocator +
                               lVar37);
            if (plVar5 == (long *)0x0) {
              if (pvVar4 != (void *)0x0) {
                local_108 = iVar40;
                free(pvVar4);
                iVar40 = local_108;
              }
            }
            else {
              local_108 = iVar40;
              (**(code **)(*plVar5 + 0x18))();
              iVar40 = local_108;
            }
          }
        }
        puVar30 = (undefined8 *)((long)&pMVar28->data + lVar37);
        *(undefined8 *)((long)&pMVar28->cstep + lVar37) = 0;
        *(undefined8 *)((long)puVar30 + 0xc) = 0;
        *(undefined8 *)((long)puVar30 + 0x14) = 0;
        *puVar30 = 0;
        puVar30[1] = 0;
        puVar30 = (undefined8 *)((long)&pMVar28->data + lVar37);
        *puVar30 = 0;
        puVar30[1] = 0;
        *(undefined8 *)((long)&pMVar28->elemsize + lVar37) = uVar42;
        *(undefined4 *)((long)&pMVar28->elempack + lVar37) = uVar44;
        *(undefined8 *)((long)&pMVar28->allocator + lVar37) = 0;
        puVar1 = (undefined4 *)((long)&pMVar28->dims + lVar37);
        *puVar1 = local_48;
        puVar1[1] = iVar36;
        puVar1[2] = iVar41;
        puVar1[3] = iVar48;
        *(int *)((long)&pMVar28->c + lVar37) = iVar40;
        *(ulong *)((long)&pMVar28->cstep + lVar37) = uVar35;
        uVar43 = uVar43 + 1;
        pMVar31 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar37 = lVar37 + 0x48;
      } while (uVar43 < (ulong)(((long)(local_100->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar31 >>
                                3) * -0x71c71c71c71c71c7));
    }
    piVar32 = &_doffset;
    Crop::eval_crop_expr
              (local_f8,&bottom_blob_shapes,&_woffset,&_hoffset,piVar32,&_coffset,&_outw,&_outh,
               &_outd,&_outc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
    pMVar45 = local_110;
    goto LAB_0027710a;
  }
  if ((this->super_Crop).woffset == -0xe9) {
    switch(uVar39) {
    case 1:
      break;
    case 2:
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000004;
      goto LAB_002779d0;
    case 3:
      break;
    case 4:
      break;
    default:
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_002779d0;
    }
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000004;
LAB_002779d0:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    piVar32 = &_hoffset;
    Crop::resolve_crop_roi
              (&this->super_Crop,(Mat *)&bottom_blob_shapes,(int *)pMVar3[1].data,&_woffset,piVar32,
               &_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar27 = (int *)CONCAT44(bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_);
    if (piVar27 != (int *)0x0) {
      LOCK();
      *piVar27 = *piVar27 + -1;
      UNLOCK();
      if ((*piVar27 != 0) ||
         (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0)) goto LAB_0027710a;
      goto LAB_00278060;
    }
    goto LAB_0027710a;
  }
  switch(uVar39) {
  case 1:
    break;
  case 2:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000004;
    goto LAB_00277a84;
  case 3:
    break;
  case 4:
    break;
  default:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_00277a84;
  }
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000004;
LAB_00277a84:
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  switch(pMVar3[1].dims) {
  case 1:
    m_1.cstep = (long)pMVar3[1].elempack * (long)pMVar3[1].w;
    m_1.elemsize = 4;
    m_1.elempack = 1;
    m_1.dims = 1;
    m_1.w = (int)m_1.cstep;
    m_1.h = 1;
    m_1.d = 1;
    m_1.c = 1;
    break;
  case 2:
    m_1.w = pMVar3[1].w;
    lVar37 = (long)pMVar3[1].elempack * (long)pMVar3[1].h;
    m_1.elemsize = 4;
    m_1.elempack = 1;
    m_1.dims = 2;
    m_1.h = (int)lVar37;
    m_1.d = 1;
    m_1.c = 1;
    m_1.cstep = lVar37 * m_1.w;
    break;
  case 3:
    m_1.w = pMVar3[1].w;
    m_1.h = pMVar3[1].h;
    m_1.c = pMVar3[1].elempack * pMVar3[1].c;
    m_1.dims = 3;
    m_1.d = 1;
    lVar37 = (long)m_1.h * (long)m_1.w;
    goto LAB_00277bec;
  case 4:
    m_1.w = pMVar3[1].w;
    m_1.h = pMVar3[1].h;
    m_1.d = pMVar3[1].d;
    m_1.c = pMVar3[1].elempack * pMVar3[1].c;
    m_1.dims = 4;
    lVar37 = (long)m_1.h * (long)m_1.w * (long)m_1.d;
LAB_00277bec:
    m_1.elempack = 1;
    m_1.elemsize = 4;
    m_1.cstep = lVar37 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m_1.cstep = 0;
    m_1.elemsize = 0;
    m_1.elempack = 0;
    m_1.dims = 0;
    m_1.w = 0;
    m_1.h = 0;
    m_1.d = 0;
    m_1.c = 0;
  }
  m_1.allocator = (Allocator *)0x0;
  m_1.refcount._4_4_ = 0;
  m_1.refcount._0_4_ = 0;
  m_1.data = (void *)0x0;
  piVar32 = &_hoffset;
  Crop::resolve_crop_roi
            (&this->super_Crop,(Mat *)&bottom_blob_shapes,&m_1,&_woffset,piVar32,&_doffset,&_coffset
             ,&_outw,&_outh,&_outd,&_outc);
  piVar27 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if (m_1.allocator == (Allocator *)0x0) {
        if (m_1.data != (void *)0x0) {
          free(m_1.data);
        }
      }
      else {
        (*(m_1.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar27 = (int *)CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if ((*piVar27 == 0) &&
       (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
LAB_00278060:
      free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start);
    }
  }
LAB_0027710a:
  pvVar46 = local_100;
  if ((iVar29 != 4) || (3 < (int)local_f0 - 1U)) goto LAB_00277d59;
  switch((int)local_f0) {
  case 1:
    uVar39 = _outw & 3;
    iVar41 = (uint)(uVar39 == 0) * 3 + 1;
    uVar43 = (long)_outw % (long)iVar41;
    if (local_17c != _outw / iVar41 || uVar39 != 0) {
      if (((_outw | _woffset) & 3U) == 0) {
        Mat::create(pMVar45,_outw / iVar41,(uVar38 >> 2) << (uVar39 == 0) * '\x02',iVar41,
                    local_118->blob_allocator);
        if (pMVar45->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar45->c * pMVar45->cstep == 0) {
          return -100;
        }
        iVar29 = _woffset + 3;
        if (-1 < _woffset) {
          iVar29 = _woffset;
        }
        crop_pack4_sse(pMVar3,pMVar45,0,iVar29 >> 2);
        return 0;
      }
      goto LAB_00277d59;
    }
    if (pMVar45 == pMVar3) {
      return 0;
    }
    piVar32 = pMVar3->refcount;
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + 1;
      UNLOCK();
    }
    piVar32 = pMVar45->refcount;
    if (piVar32 == (int *)0x0) goto LAB_002780dd;
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 != 0) goto LAB_002780dd;
    pvVar4 = pMVar45->data;
    pAVar6 = pMVar45->allocator;
joined_r0x00277420:
    if (pAVar6 == (Allocator *)0x0) {
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
      }
    }
    else {
      (*pAVar6->_vptr_Allocator[3])(pAVar6,pvVar4,uVar43 & 0xffffffff);
    }
LAB_002780dd:
    pMVar45->cstep = 0;
    pMVar45->data = (void *)0x0;
    pMVar45->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&pMVar45->refcount + 4) = (undefined1  [16])0x0;
    pMVar45->dims = 0;
    pMVar45->w = 0;
    pMVar45->h = 0;
    pMVar45->d = 0;
    pMVar45->c = 0;
    piVar32 = pMVar3->refcount;
    pMVar45->data = pMVar3->data;
    pMVar45->refcount = piVar32;
    pMVar45->elemsize = pMVar3->elemsize;
    pMVar45->elempack = pMVar3->elempack;
    pMVar45->allocator = pMVar3->allocator;
    iVar29 = pMVar3->w;
    iVar41 = pMVar3->h;
    iVar48 = pMVar3->d;
    pMVar45->dims = pMVar3->dims;
    pMVar45->w = iVar29;
    pMVar45->h = iVar41;
    pMVar45->d = iVar48;
    pMVar45->c = pMVar3->c;
    pMVar45->cstep = pMVar3->cstep;
    return 0;
  case 2:
    if (_outw == local_17c) {
      iVar41 = (uint)((_outh & 3U) == 0) * 3 + 1;
      uVar43 = (long)_outh % (long)iVar41;
      if (((_outh & 3U) == 0) && (_outh / iVar41 == local_178)) {
        if (pMVar45 == pMVar3) {
          return 0;
        }
        piVar32 = pMVar3->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
        piVar32 = pMVar45->refcount;
        if (piVar32 == (int *)0x0) goto LAB_002780dd;
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 != 0) goto LAB_002780dd;
        pvVar4 = pMVar45->data;
        pAVar6 = pMVar45->allocator;
        goto joined_r0x00277420;
      }
    }
    if (((_hoffset | _outh) & 3U) == 0) {
      Mat::create(pMVar45,_outw,_outh >> 2,(uVar38 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                  local_118->blob_allocator);
      if (pMVar45->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar45->c * pMVar45->cstep == 0) {
        return -100;
      }
      iVar29 = _hoffset + 3;
      if (-1 < _hoffset) {
        iVar29 = _hoffset;
      }
      crop_pack4_sse(pMVar3,pMVar45,iVar29 >> 2,_woffset);
      return 0;
    }
LAB_00277d59:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blobs_unpacked,
               ((long)(local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
               (allocator_type *)&bottom_blob_shapes);
    pMVar31 = (pvVar46->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((pvVar46->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar31) {
      lVar37 = 0;
      uVar38 = 0;
      do {
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)((long)&pMVar31->data + lVar37);
        piVar32 = *(int **)((long)&pMVar31->refcount + lVar37);
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = SUB84(piVar32,0);
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)&pMVar31->elemsize + lVar37);
        uVar44 = *(undefined4 *)((long)&pMVar31->elempack + lVar37);
        plVar5 = *(long **)((long)&pMVar31->allocator + lVar37);
        puVar30 = (undefined8 *)((long)&pMVar31->dims + lVar37);
        uVar42 = *puVar30;
        uVar10 = puVar30[1];
        iVar41 = *(int *)((long)&pMVar31->c + lVar37);
        lVar34 = *(long *)((long)&pMVar31->cstep + lVar37);
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
        if (iVar29 == 1) {
LAB_00277e7a:
          pMVar31 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar3 = (Mat *)((long)&(bottom_blobs_unpacked.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start)->data + lVar37);
          bVar47 = true;
          piVar32 = (int *)CONCAT44(bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
          pvVar46 = local_100;
          if (pMVar3 != (Mat *)&bottom_blob_shapes) {
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + 1;
              UNLOCK();
            }
            piVar32 = *(int **)((long)&(bottom_blobs_unpacked.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->refcount + lVar37
                               );
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + -1;
              UNLOCK();
              if (*piVar32 == 0) {
                pvVar4 = *(void **)((long)&(bottom_blobs_unpacked.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->data +
                                   lVar37);
                plVar7 = *(long **)((long)&(bottom_blobs_unpacked.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->allocator +
                                   lVar37);
                if (plVar7 == (long *)0x0) {
                  if (pvVar4 != (void *)0x0) {
                    free(pvVar4);
                  }
                }
                else {
                  (**(code **)(*plVar7 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&pMVar31->cstep + lVar37) = 0;
            *(undefined1 (*) [16])((long)&pMVar3->refcount + 4) = (undefined1  [16])0x0;
            pMVar3->data = (void *)0x0;
            pMVar3->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&pMVar31->dims + lVar37) = (undefined1  [16])0x0;
            *(undefined4 *)((long)&pMVar31->c + lVar37) = 0;
            *(pointer *)((long)&pMVar31->data + lVar37) =
                 bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            piVar32 = (int *)CONCAT44(bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                      bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._0_4_);
            *(int **)((long)&pMVar31->refcount + lVar37) = piVar32;
            *(pointer *)((long)&pMVar31->elemsize + lVar37) =
                 bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            *(undefined4 *)((long)&pMVar31->elempack + lVar37) = uVar44;
            *(long **)((long)&pMVar31->allocator + lVar37) = plVar5;
            puVar30 = (undefined8 *)((long)&pMVar31->dims + lVar37);
            *puVar30 = uVar42;
            puVar30[1] = uVar10;
            *(int *)((long)&pMVar31->c + lVar37) = iVar41;
            *(long *)((long)&pMVar31->cstep + lVar37) = lVar34;
            pvVar46 = local_100;
          }
        }
        else {
          m_1.data = *(void **)local_118;
          m_1.elemsize = (size_t)local_118->workspace_allocator;
          uVar11 = local_118->openmp_blocktime;
          uVar12 = local_118->use_winograd_convolution;
          uVar14 = local_118->use_sgemm_convolution;
          uVar16 = local_118->use_int8_inference;
          uVar18 = local_118->use_vulkan_compute;
          uVar17 = CONCAT11(uVar18,uVar16);
          uVar15 = CONCAT21(uVar17,uVar14);
          uVar13 = CONCAT31(uVar15,uVar12);
          m_1.allocator = *(Allocator **)&local_118->use_bf16_storage;
          uVar19 = local_118->vulkan_device_index;
          uVar20 = local_118->use_reserved_1;
          uVar22 = local_118->use_image_storage;
          uVar24 = local_118->use_tensor_storage;
          uVar26 = local_118->use_reserved_2;
          uVar25 = CONCAT11(uVar26,uVar24);
          uVar23 = CONCAT21(uVar25,uVar22);
          uVar21 = CONCAT31(uVar23,uVar20);
          m_1.h = local_118->flush_denormals;
          m_1.d._0_1_ = local_118->use_local_pool_allocator;
          m_1.d._1_1_ = local_118->use_shader_local_memory;
          m_1.d._2_1_ = local_118->use_cooperative_matrix;
          m_1.d._3_1_ = local_118->use_winograd23_convolution;
          m_1.c._0_1_ = local_118->use_winograd43_convolution;
          m_1.c._1_1_ = local_118->use_winograd63_convolution;
          m_1.c._2_1_ = local_118->use_a53_a55_optimized_kernel;
          m_1.c._3_1_ = local_118->use_fp16_uniform;
          m_1._60_1_ = local_118->use_int8_uniform;
          m_1._61_1_ = local_118->use_reserved_9;
          m_1._62_1_ = local_118->use_reserved_10;
          m_1._63_1_ = local_118->use_reserved_11;
          m_1.refcount._0_4_ = SUB84(local_118->workspace_allocator,0);
          m_1.refcount._4_4_ = (undefined4)((ulong)local_118->workspace_allocator >> 0x20);
          m_1.elempack = uVar11;
          m_1._28_4_ = uVar13;
          m_1.dims = uVar19;
          m_1.w = uVar21;
          convert_packing((Mat *)((long)&((pvVar46->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_start)->data + lVar37)
                          ,(Mat *)&bottom_blob_shapes,1,(Option *)&m_1);
          if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) && (iVar41 * lVar34 != 0))
          goto LAB_00277e7a;
          piVar32 = (int *)CONCAT44(bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
          bVar47 = false;
        }
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (plVar5 == (long *)0x0) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              (**(code **)(*plVar5 + 0x18))();
            }
          }
        }
        if (!bVar47) {
          iVar29 = -100;
          goto LAB_00277fed;
        }
        uVar38 = uVar38 + 1;
        pMVar31 = (pvVar46->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar37 = lVar37 + 0x48;
      } while (uVar38 < (ulong)(((long)(pvVar46->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar31 >>
                                3) * -0x71c71c71c71c71c7));
    }
    iVar29 = Crop::forward(local_f8,&bottom_blobs_unpacked,top_blobs,local_118);
LAB_00277fed:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
    return iVar29;
  case 4:
    uVar39 = _outc & 3;
    bVar47 = local_e4 == _outd;
    bVar8 = local_178 == _outh;
    bVar9 = local_17c == _outw;
    if (bVar47 && (bVar8 && bVar9)) {
      iVar41 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar43 = (long)_outc % (long)iVar41;
      if (((_outc & 3U) == 0) && (_outc / iVar41 == local_180)) {
        if (pMVar45 == pMVar3) {
          return 0;
        }
        piVar32 = pMVar3->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
        piVar32 = pMVar45->refcount;
        if (piVar32 == (int *)0x0) goto LAB_002780dd;
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 != 0) goto LAB_002780dd;
        pvVar4 = pMVar45->data;
        pAVar6 = pMVar45->allocator;
        goto joined_r0x00277420;
      }
    }
    if (((_coffset | _outc) & 3U) != 0) goto LAB_00277d59;
    iVar29 = pMVar3->w;
    iVar41 = pMVar3->h;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pMVar3->elemsize;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)(_coffset >> 2) * pMVar3->cstep *
                   (long)bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + (long)pMVar3->data);
    iVar48 = pMVar3->elempack;
    pAVar6 = pMVar3->allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    uVar43 = ((long)pMVar3->d *
              (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage * (long)iVar41 * (long)iVar29
              + 0xfU & 0xfffffffffffffff0) /
             (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_110 = pMVar45;
    if (bVar47 && (bVar8 && bVar9)) {
      Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,local_118->blob_allocator,_outd,
                 (void *)CONCAT71((int7)((ulong)piVar32 >> 8),bVar47 && (bVar8 && bVar9)));
      pMVar3 = local_110;
      piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (local_110 != &m_1) {
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
        piVar32 = local_110->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_110->allocator == (Allocator *)0x0) {
              if (local_110->data != (void *)0x0) {
                free(local_110->data);
              }
            }
            else {
              (*local_110->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3->data = m_1.data;
        piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        pMVar3->refcount = piVar32;
        pMVar3->elemsize = m_1.elemsize;
        pMVar3->elempack = m_1.elempack;
        pMVar3->allocator = m_1.allocator;
        pMVar3->dims = m_1.dims;
        pMVar3->w = m_1.w;
        pMVar3->h = m_1.h;
        pMVar3->d = m_1.d;
        pMVar3->c = m_1.c;
        pMVar3->cstep = m_1.cstep;
      }
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar36 = -100;
      if ((local_110->data != (void *)0x0) && ((long)local_110->c * local_110->cstep != 0))
      goto LAB_00278527;
    }
    else {
LAB_00278527:
      pMVar3 = local_110;
      iVar36 = _outc + 3;
      if (-1 < _outc) {
        iVar36 = _outc;
      }
      Mat::create(local_110,_outw,_outh,_outd,iVar36 >> 2,(uVar38 >> 2) << (uVar39 == 0) * '\x02',4,
                  local_118->blob_allocator);
      pMVar45 = local_110;
      iVar36 = -100;
      if (pMVar3->data != (void *)0x0) {
        uVar38 = (ulong)pMVar3->c;
        if (pMVar3->cstep * uVar38 != 0) {
          if (0 < pMVar3->c) {
            uVar35 = (ulong)(uint)_outd;
            lVar37 = 0;
            do {
              if (0 < (int)uVar35) {
                lVar34 = 0;
                do {
                  m_1.cstep = (long)iVar41 * (long)iVar29;
                  m_1.data = (void *)((long)&(bottom_blob_shapes.
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->data +
                                     (long)(_doffset + (int)lVar34) *
                                     (long)bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage *
                                     m_1.cstep +
                                     uVar43 * lVar37 *
                                     (long)bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize = (size_t)bottom_blob_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                  m_1.dims = 2;
                  m_1.d = 1;
                  m_1.c = 1;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pMVar45->elemsize;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)pMVar45->data +
                                lVar34 * (long)bottom_blobs_unpacked.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage *
                                (long)pMVar45->h * (long)pMVar45->w +
                                pMVar45->cstep * lVar37 *
                                (long)bottom_blobs_unpacked.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  m_1.elempack = iVar48;
                  m_1.allocator = pAVar6;
                  m_1.w = iVar29;
                  m_1.h = iVar41;
                  crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                  uVar35 = (ulong)_outd;
                  lVar34 = lVar34 + 1;
                } while (lVar34 < (long)uVar35);
                uVar38 = (ulong)(uint)pMVar45->c;
              }
              lVar37 = lVar37 + 1;
            } while (lVar37 < (int)uVar38);
          }
          iVar36 = 0;
        }
      }
    }
    piVar32 = (int *)CONCAT44(bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_);
    if (piVar32 == (int *)0x0) {
      return iVar36;
    }
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 != 0) {
      return iVar36;
    }
    if (pAVar6 != (Allocator *)0x0) {
      (*pAVar6->_vptr_Allocator[3])();
      return iVar36;
    }
    goto joined_r0x0027874f;
  }
  uVar39 = _outc & 3;
  uVar33 = local_178 ^ _outh | local_17c ^ _outw;
  bVar47 = uVar33 == 0;
  if (bVar47) {
    iVar41 = (uint)((_outc & 3U) == 0) * 3 + 1;
    uVar43 = (long)_outc % (long)iVar41;
    if (((_outc & 3U) == 0) && (_outc / iVar41 == local_180)) {
      if (pMVar45 == pMVar3) {
        return 0;
      }
      piVar32 = pMVar3->refcount;
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + 1;
        UNLOCK();
      }
      piVar32 = pMVar45->refcount;
      if (piVar32 == (int *)0x0) goto LAB_002780dd;
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 != 0) goto LAB_002780dd;
      pvVar4 = pMVar45->data;
      pAVar6 = pMVar45->allocator;
      goto joined_r0x00277420;
    }
  }
  if (((_coffset | _outc) & 3U) != 0) goto LAB_00277d59;
  iVar29 = pMVar3->w;
  iVar41 = pMVar3->h;
  iVar48 = pMVar3->d;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pMVar3->elemsize;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)(_coffset >> 2) * pMVar3->cstep *
                 (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + (long)pMVar3->data);
  iVar40 = pMVar3->elempack;
  pAVar6 = pMVar3->allocator;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  uVar43 = ((long)iVar48 *
            (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage * (long)iVar41 * (long)iVar29 +
            0xfU & 0xfffffffffffffff0) /
           (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar2 = pMVar3->dims;
  if (bVar47) {
    Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,local_118->blob_allocator,
               CONCAT31((int3)(uVar33 >> 8),bVar47),(void *)(ulong)(uint)_outh);
    piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    if (pMVar45 != &m_1) {
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + 1;
        UNLOCK();
      }
      piVar32 = pMVar45->refcount;
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (pMVar45->allocator == (Allocator *)0x0) {
            if (pMVar45->data != (void *)0x0) {
              free(pMVar45->data);
            }
          }
          else {
            (*pMVar45->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar45->data = m_1.data;
      piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      pMVar45->refcount = piVar32;
      pMVar45->elemsize = m_1.elemsize;
      pMVar45->elempack = m_1.elempack;
      pMVar45->allocator = m_1.allocator;
      pMVar45->dims = m_1.dims;
      pMVar45->w = m_1.w;
      pMVar45->h = m_1.h;
      pMVar45->d = m_1.d;
      pMVar45->c = m_1.c;
      pMVar45->cstep = m_1.cstep;
    }
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 == 0) {
        if (m_1.allocator == (Allocator *)0x0) {
          if (m_1.data != (void *)0x0) {
            free(m_1.data);
          }
        }
        else {
          (*(m_1.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar36 = -100;
    if ((pMVar45->data != (void *)0x0) && ((long)pMVar45->c * pMVar45->cstep != 0))
    goto LAB_0027820a;
  }
  else {
LAB_0027820a:
    iVar36 = _outc + 3;
    if (-1 < _outc) {
      iVar36 = _outc;
    }
    Mat::create(pMVar45,_outw,_outh,iVar36 >> 2,(uVar38 >> 2) << (uVar39 == 0) * '\x02',4,
                local_118->blob_allocator);
    iVar36 = -100;
    if ((pMVar45->data != (void *)0x0) && (pMVar45->cstep * (long)pMVar45->c != 0)) {
      if (0 < pMVar45->c) {
        lVar37 = 0;
        do {
          m_1.data = (void *)((long)&(bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data +
                             uVar43 * lVar37 *
                             (long)bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage);
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize = (size_t)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
          m_1.d = 1;
          m_1.dims = iVar2 + -1;
          m_1.cstep = ((long)bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage * (long)iVar41 * (long)iVar29
                       + 0xfU & 0xfffffffffffffff0) /
                      (ulong)bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
          if (iVar2 == 4) {
            m_1.cstep = (long)iVar41 * (long)iVar29;
          }
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pMVar45->elemsize;
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(pMVar45->cstep * lVar37 *
                         (long)bottom_blobs_unpacked.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + (long)pMVar45->data);
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          m_1.elempack = iVar40;
          m_1.allocator = pAVar6;
          m_1.w = iVar29;
          m_1.h = iVar41;
          m_1.c = iVar48;
          crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
          lVar37 = lVar37 + 1;
        } while (lVar37 < pMVar45->c);
      }
      iVar36 = 0;
    }
  }
  piVar32 = (int *)CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar32 == (int *)0x0) {
    return iVar36;
  }
  LOCK();
  *piVar32 = *piVar32 + -1;
  UNLOCK();
  if (*piVar32 != 0) {
    return iVar36;
  }
  if (pAVar6 != (Allocator *)0x0) {
    (*pAVar6->_vptr_Allocator[3])();
    return iVar36;
  }
joined_r0x0027874f:
  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return iVar36;
  }
  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start);
  return iVar36;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(bottom_blobs.size());
        for (size_t i = 0; i < bottom_blobs.size(); i++)
        {
            bottom_blob_shapes[i] = bottom_blobs[i].shape();
        }
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    std::vector<Mat> bottom_blobs_unpacked(bottom_blobs.size());
    for (size_t i = 0; i < bottom_blobs.size(); i++)
    {
        Mat bottom_blob_unpacked = bottom_blobs[i];
        if (elempack != 1)
        {
            Option opt_pack1 = opt;
            opt_pack1.blob_allocator = opt.workspace_allocator;

            convert_packing(bottom_blobs[i], bottom_blob_unpacked, 1, opt_pack1);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        bottom_blobs_unpacked[i] = bottom_blob_unpacked;
    }

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}